

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall
ProString::startsWith<ProString_const&,char_const(&)[2]>
          (ProString *this,QStringBuilder<const_ProString_&,_const_char_(&)[2]> *str)

{
  byte bVar1;
  ProString *in_RSI;
  QStringBuilder<const_ProString_&,_const_char_(&)[2]> *in_RDI;
  long in_FS_OFFSET;
  CaseSensitivity cs;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cs = (CaseSensitivity)((ulong)local_20 >> 0x20);
  ::QStringBuilder::operator_cast_to_QString(in_RDI);
  bVar1 = startsWith(in_RSI,(QString *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
                     ,cs);
  QString::~QString((QString *)0x13aabe);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool startsWith(const QStringBuilder<A, B> &str) { return startsWith(QString(str)); }